

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iRpn.cpp
# Opt level: O0

void __thiscall Imaginer::Utils::iRpn::cut(iRpn *this)

{
  bool bVar1;
  RPNnode *pRVar2;
  ostream *poVar3;
  iStack<Imaginer::Utils::iRpn::RPNnode> local_68;
  int local_58;
  int local_54;
  int flag;
  int i;
  int size;
  int local_3c;
  undefined1 local_38 [8];
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> funList;
  undefined1 local_20 [8];
  iStack<Imaginer::Utils::iRpn::RPNnode> result;
  iRpn *this_local;
  
  funList._top = 0x400;
  result._8_8_ = this;
  iStack<Imaginer::Utils::iRpn::RPNnode>::iStack
            ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20,&funList._top);
  local_3c = 0x400;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
            ((iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *)local_38,&local_3c)
  ;
  flag = iStack<Imaginer::Utils::iRpn::RPNnode>::size(this->_operands);
  local_58 = 0;
  for (local_54 = 0; local_54 < flag; local_54 = local_54 + 1) {
    pRVar2 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[](this->_operands,local_54);
    bVar1 = RPNnode::operator_cast_to_bool(pRVar2);
    if (bVar1) {
      pRVar2 = iStack<Imaginer::Utils::iRpn::RPNnode>::operator[](this->_operands,local_54 + 1);
      bVar1 = RPNnode::operator_cast_to_bool(pRVar2);
      if (bVar1) {
        iStack<Imaginer::Utils::iRpn::RPNnode>::cut(&local_68,(int)this->_operands,local_58);
        iStack<Imaginer::Utils::iRpn::RPNnode>::operator=
                  ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20,&local_68);
        iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack(&local_68);
        local_58 = local_58 + local_54;
        poVar3 = operator<<((ostream *)&std::cout,(iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20
                           );
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::push
                  ((iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *)local_38,
                   (iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20);
      }
    }
  }
  poVar3 = operator<<((ostream *)&std::cout,
                      (iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *)local_38);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = operator<<((ostream *)&std::cout,(iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::~iStack
            ((iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *)local_38);
  iStack<Imaginer::Utils::iRpn::RPNnode>::~iStack
            ((iStack<Imaginer::Utils::iRpn::RPNnode> *)local_20);
  return;
}

Assistant:

void iRpn::cut()
{
    iStack<RPNnode> result;
    iStack< iStack<RPNnode> > funList;
    int size = _operands->size();
    int i = 0;
    int flag = 0;
    for(;i < size;++i)
    {
        if((*_operands)[i] && (*_operands)[i+1])
        {
            result = _operands->cut(flag,flag+i);
            flag += i;
            std::cout << result << std::endl;
            funList.push(result);
            continue;
        }
    }
    //funList = _operands->cut(0,i);
    //result  = _operands->copy();
    std::cout << funList << std::endl;
    std::cout << result << std::endl;
}